

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TikzPlotter.cpp
# Opt level: O2

void __thiscall vectorgraphics::TikzPlotter::makePDF(TikzPlotter *this,path *path,string *name)

{
  bool bVar1;
  ostream *__os;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  string *this_00;
  string asStack_198 [32];
  string local_178;
  string local_158 [32];
  path full_tex_path;
  undefined1 local_110 [80];
  path local_c0;
  undefined1 local_98 [80];
  string tex_name;
  
  std::operator+(&tex_name,name,".tex");
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)(local_98 + 0x28),&tex_name,auto_format);
  std::filesystem::__cxx11::operator/(&full_tex_path,path,(path *)(local_98 + 0x28));
  std::filesystem::__cxx11::path::~path((path *)(local_98 + 0x28));
  std::filesystem::create_directories(path);
  std::filesystem::__cxx11::path::path((path *)local_98,path);
  std::__cxx11::string::string(local_158,(string *)name);
  cleanup((TikzPlotter *)local_98,(EVP_PKEY_CTX *)local_158);
  std::__cxx11::string::~string(local_158);
  std::filesystem::__cxx11::path::~path((path *)local_98);
  std::filesystem::__cxx11::path::path(&local_c0,&full_tex_path);
  bVar1 = createTexFile(this,&local_c0);
  std::filesystem::__cxx11::path::~path(&local_c0);
  if (bVar1) {
    std::filesystem::__cxx11::path::path((path *)(local_110 + 0x28),path);
    this_00 = &local_178;
    std::__cxx11::string::string((string *)this_00,(string *)name);
    bVar1 = compileTexFile((TikzPlotter *)this_00,(path *)(local_110 + 0x28),&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::filesystem::__cxx11::path::~path((path *)(local_110 + 0x28));
    if (bVar1) {
      __os = std::operator<<((ostream *)&std::cout,"makePDF: PDF succesfully created at ");
      pbVar2 = std::filesystem::__cxx11::operator<<(__os,&full_tex_path);
      std::endl<char,std::char_traits<char>>(pbVar2);
    }
  }
  std::filesystem::__cxx11::path::path((path *)local_110,path);
  std::__cxx11::string::string(asStack_198,(string *)name);
  cleanup((TikzPlotter *)local_110,(EVP_PKEY_CTX *)asStack_198);
  std::__cxx11::string::~string(asStack_198);
  std::filesystem::__cxx11::path::~path((path *)local_110);
  std::filesystem::__cxx11::path::~path(&full_tex_path);
  std::__cxx11::string::~string((string *)&tex_name);
  return;
}

Assistant:

void TikzPlotter::makePDF(std::filesystem::path path, std::string name) {
    std::string tex_name = name + ".tex";
    std::filesystem::path full_tex_path = path / tex_name;

    // create directories
    std::filesystem::create_directories(path);

    // clean up before, in case there are some left over files
    cleanup(path, name);

    if (createTexFile(full_tex_path)) {
      if (compileTexFile(path, name)) {
        std::cout << "makePDF: PDF succesfully created at " << full_tex_path << std::endl;
      }
    }

    // clean up after
    cleanup(path, name);
  }